

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_DDictHashSet_emplaceDDict(ZSTD_DDictHashSet *hashSet,ZSTD_DDict *ddict)

{
  ZSTD_DDict **ppZVar1;
  ulong uVar2;
  size_t sVar3;
  U32 dictID;
  
  if (ddict == (ZSTD_DDict *)0x0) {
    dictID = 0;
  }
  else {
    dictID = ddict->dictID;
  }
  uVar2 = ZSTD_DDictHashSet_getIndex(hashSet,dictID);
  sVar3 = hashSet->ddictPtrCount;
  if (sVar3 == hashSet->ddictPtrTableSize) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    ppZVar1 = hashSet->ddictPtrTable;
    for (; ppZVar1[uVar2] != (ZSTD_DDict *)0x0; uVar2 = (uVar2 & hashSet->ddictPtrTableSize - 1) + 1
        ) {
      if (ppZVar1[uVar2]->dictID == dictID) {
        ppZVar1[uVar2] = ddict;
        goto LAB_001aba42;
      }
    }
    ppZVar1[uVar2] = ddict;
    hashSet->ddictPtrCount = sVar3 + 1;
LAB_001aba42:
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

static size_t ZSTD_DDictHashSet_emplaceDDict(ZSTD_DDictHashSet* hashSet, const ZSTD_DDict* ddict) {
    const U32 dictID = ZSTD_getDictID_fromDDict(ddict);
    size_t idx = ZSTD_DDictHashSet_getIndex(hashSet, dictID);
    const size_t idxRangeMask = hashSet->ddictPtrTableSize - 1;
    RETURN_ERROR_IF(hashSet->ddictPtrCount == hashSet->ddictPtrTableSize, GENERIC, "Hash set is full!");
    DEBUGLOG(4, "Hashed index: for dictID: %u is %zu", dictID, idx);
    while (hashSet->ddictPtrTable[idx] != NULL) {
        /* Replace existing ddict if inserting ddict with same dictID */
        if (ZSTD_getDictID_fromDDict(hashSet->ddictPtrTable[idx]) == dictID) {
            DEBUGLOG(4, "DictID already exists, replacing rather than adding");
            hashSet->ddictPtrTable[idx] = ddict;
            return 0;
        }
        idx &= idxRangeMask;
        idx++;
    }
    DEBUGLOG(4, "Final idx after probing for dictID %u is: %zu", dictID, idx);
    hashSet->ddictPtrTable[idx] = ddict;
    hashSet->ddictPtrCount++;
    return 0;
}